

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avPacket.h
# Opt level: O2

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<AVChapter*,std::vector<AVChapter,std::allocator<AVChapter>>>,__gnu_cxx::__ops::_Iter_less_iter>
               (AVChapter *__result,AVChapter *__a,AVChapter *__b,AVChapter *__c)

{
  long lVar1;
  long lVar2;
  long lVar3;
  AVChapter *__b_00;
  
  lVar1 = __a->start;
  lVar2 = __b->start;
  lVar3 = __c->start;
  if (lVar1 < lVar2) {
    __b_00 = __b;
    if ((lVar3 <= lVar2) && (__b_00 = __a, lVar1 < lVar3)) {
      __b_00 = __c;
    }
  }
  else {
    __b_00 = __a;
    if ((lVar3 <= lVar1) && (__b_00 = __b, lVar2 < lVar3)) {
      __b_00 = __c;
    }
  }
  swap<AVChapter>(__result,__b_00);
  return;
}

Assistant:

bool operator<(const AVChapter& other) const { return start < other.start; }